

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::SummaryTest_construction_with_dynamic_quantile_vector_Test::TestBody
          (SummaryTest_construction_with_dynamic_quantile_vector_Test *this)

{
  initializer_list<prometheus::detail::CKMSQuantiles::Quantile> __l;
  allocator_type local_a9;
  Quantiles quantiles;
  Summary summary;
  
  detail::CKMSQuantiles::Quantile::Quantile((Quantile *)&summary,0.99,0.001);
  __l._M_len = 1;
  __l._M_array = (iterator)&summary;
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::vector(&quantiles,__l,&local_a9);
  detail::CKMSQuantiles::Quantile::Quantile((Quantile *)&summary,0.5,0.05);
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::emplace_back<prometheus::detail::CKMSQuantiles::Quantile>(&quantiles,(Quantile *)&summary);
  Summary::Summary(&summary,&quantiles,(milliseconds)0x3e8,2);
  Summary::Observe(&summary,8.0);
  Summary::~Summary(&summary);
  std::
  _Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::~_Vector_base(&quantiles.
                   super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
                 );
  return;
}

Assistant:

TEST(SummaryTest, construction_with_dynamic_quantile_vector) {
  auto quantiles = Summary::Quantiles{{0.99, 0.001}};
  quantiles.push_back({0.5, 0.05});

  Summary summary{quantiles, std::chrono::seconds(1), 2};
  summary.Observe(8.0);
}